

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matsolve.c
# Opt level: O3

int mat_lu(MATRIX A,MATRIX P)

{
  double *pdVar1;
  double *pdVar2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  double *pdVar8;
  ulong uVar9;
  ulong uVar10;
  double dVar11;
  double dVar12;
  
  iVar3 = *(int *)((long)A + -4);
  uVar5 = (ulong)iVar3;
  if ((long)uVar5 < 1) {
    return 0;
  }
  uVar4 = 0;
  do {
    *P[uVar4] = (double)(int)uVar4;
    uVar4 = uVar4 + 1;
  } while (uVar5 != uVar4);
  if (iVar3 < 1) {
    iVar3 = 0;
  }
  else {
    uVar6 = 1;
    iVar3 = 0;
    uVar4 = 0;
    do {
      dVar11 = 0.0;
      uVar7 = uVar4;
      uVar9 = uVar4;
      do {
        dVar12 = ABS(A[(int)*P[uVar7]][uVar4]);
        uVar10 = uVar9;
        if (dVar11 < dVar12) {
          uVar10 = uVar7;
        }
        uVar9 = uVar10 & 0xffffffff;
        if (dVar12 <= dVar11) {
          dVar12 = dVar11;
        }
        dVar11 = dVar12;
        uVar7 = uVar7 + 1;
      } while (uVar5 != uVar7);
      if (uVar4 == uVar9) {
        pdVar8 = P[uVar4];
      }
      else {
        iVar3 = iVar3 + 1;
        pdVar8 = P[uVar4];
        pdVar1 = P[(int)uVar10];
        dVar11 = *pdVar8;
        *pdVar8 = *pdVar1;
        *pdVar1 = (double)(int)dVar11;
      }
      if ((A[(int)*pdVar8][uVar4] == 0.0) && (!NAN(A[(int)*pdVar8][uVar4]))) {
        return -1;
      }
      uVar7 = uVar4 + 1;
      uVar9 = uVar6;
      if (uVar7 < uVar5) {
        do {
          pdVar1 = P[uVar9];
          A[(int)*pdVar1][uVar4] = A[(int)*pdVar1][uVar4] / A[(int)*pdVar8][uVar4];
          uVar10 = uVar6;
          do {
            pdVar2 = A[(int)*pdVar1];
            pdVar2[uVar10] = pdVar2[uVar10] - pdVar2[uVar4] * A[(int)*pdVar8][uVar10];
            uVar10 = uVar10 + 1;
          } while (uVar5 != uVar10);
          uVar9 = uVar9 + 1;
        } while (uVar9 != uVar5);
      }
      uVar6 = uVar6 + 1;
      uVar4 = uVar7;
    } while (uVar7 != uVar5);
  }
  return iVar3;
}

Assistant:

int mat_lu( MATRIX A, MATRIX P )
{
	int	i, j, k, n;
	int	maxi, tmp;
	double	c, c1;
	int	p;

	n = MatCol(A);

	for (p=0,i=0; i<n; i++)
		{
		P[i][0] = i;
		}

	for (k=0; k<n; k++)
	{
	/*
	* --- partial pivoting ---
	*/
	for (i=k, maxi=k, c=0.0; i<n; i++)
		{
		c1 = fabs( A[(int)P[i][0]][k] );
		if (c1 > c)
			{
			c = c1;
			maxi = i;
			}
		}

	/*
	*	row exchange, update permutation vector
	*/
	if (k != maxi)
		{
		p++;
		tmp = P[k][0];
		P[k][0] = P[maxi][0];
		P[maxi][0] = tmp;
		}

	/*
	*	suspected singular matrix
	*/
	if ( A[(int)P[k][0]][k] == 0.0 )
		return (-1);

	for (i=k+1; i<n; i++)
		{
		/*
		* --- calculate m(i,j) ---
		*/
		A[(int)P[i][0]][k] = A[(int)P[i][0]][k] / A[(int)P[k][0]][k];

		/*
		* --- elimination ---
		*/
		for (j=k+1; j<n; j++)
			{
			A[(int)P[i][0]][j] -= A[(int)P[i][0]][k] * A[(int)P[k][0]][j];
			}
		}
	}

	return (p);
}